

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDException.hpp
# Opt level: O1

void __thiscall OpenMD::OpenMDException::~OpenMDException(OpenMDException *this)

{
  ~OpenMDException(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

~OpenMDException() throw() {}